

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<TPZFlopCounter>::Inverse
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *Inv,DecomposeType dec)

{
  long lVar1;
  _func_int **pp_Var2;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long lVar6;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  if (lVar1 != 0) {
    if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
      (*(Inv->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(Inv,lVar1,lVar1);
      (*(Inv->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xf])(Inv);
      if (0 < lVar1) {
        lVar6 = 0;
        do {
          if (((Inv->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow <= lVar6) ||
             ((Inv->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar6)) {
            TPZFMatrix<TPZFlopCounter>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Inv->fElem
          [(Inv->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow * lVar6 + lVar6].fVal =
               1.0;
          lVar6 = lVar6 + 1;
        } while (lVar1 != lVar6);
      }
      pp_Var2 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
      if (dec == ENoDecompose) {
        iVar3 = (*pp_Var2[0x10])(this);
        UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x41];
        if (iVar3 == 0) {
          uVar5 = 1;
        }
        else {
          uVar5 = 4;
        }
        iVar3 = (*UNRECOVERED_JUMPTABLE)(this,Inv,uVar5,UNRECOVERED_JUMPTABLE);
        return iVar3;
      }
      (*pp_Var2[0x41])(this,Inv);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "int TPZMatrix<TPZFlopCounter>::Inverse(TPZFMatrix<TVar> &, DecomposeType) [T = TPZFlopCounter]"
                 ,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," - Cols() = ",0xc);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  return 0;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}